

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_sectors.cxx
# Opt level: O2

void __thiscall
xray_re::xr_level_sectors::load(xr_level_sectors *this,uint32_t xrlc_version,xr_reader *r)

{
  uint __line;
  xr_reader *pxVar1;
  xr_reader *local_18;
  
  local_18 = (xr_reader *)0x0;
  if (xrlc_version < 10) {
    local_18 = xr_reader::open_chunk(r,xrlc_version == 5 | 10);
    if (local_18 == (xr_reader *)0x0) {
      __line = 0x35;
      local_18 = (xr_reader *)0x0;
LAB_0015ddd3:
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                    ,__line,"void xray_re::xr_level_sectors::load(uint32_t, xr_reader &)");
    }
    xr_reader::
    r_chunks<std::vector<xray_re::sector_data*,std::allocator<xray_re::sector_data*>>,read_sector_v5>
              (local_18,&this->m_sectors);
  }
  else {
    pxVar1 = xr_reader::open_chunk(r,8);
    if (pxVar1 == (xr_reader *)0x0) {
      __line = 0x39;
      goto LAB_0015ddd3;
    }
    xr_reader::
    r_chunks<std::vector<xray_re::sector_data*,std::allocator<xray_re::sector_data*>>,read_sector_v13>
              (pxVar1,&this->m_sectors);
  }
  xr_reader::close_chunk(r,&local_18);
  return;
}

Assistant:

void xr_level_sectors::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version <= XRLC_VERSION_9) {
		if (xrlc_version == XRLC_VERSION_5)
			s = r.open_chunk(FSL5_SECTORS);
		else
			s = r.open_chunk(FSL8_SECTORS);
		xr_assert(s);
		load_v5(*s);
	} else {
		xr_reader* s = r.open_chunk(FSL13_SECTORS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}